

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift,__m128i *clip_low,__m128i *clip_high,
               __m128i *max_mask)

{
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  void *in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i mask0b;
  __m128i mask0a;
  int in_stack_00000144;
  CONV_BUF_TYPE *in_stack_00000148;
  int in_stack_00000154;
  CONV_BUF_TYPE *in_stack_00000158;
  int in_stack_00000164;
  uint16_t *in_stack_00000168;
  __m128i *in_stack_00000600;
  __m128i *in_stack_00000608;
  __m128i *in_stack_00000610;
  int in_stack_00000618;
  __m128i *in_stack_00000620;
  __m128i *in_stack_00000628;
  __m128i *in_stack_00000630;
  undefined8 local_48;
  undefined8 local_38;
  
  do {
    xx_loadl_64(in_stack_00000008);
    local_38 = extraout_XMM0._0_8_;
    pmovzxbw(extraout_XMM0,local_38);
    xx_loadl_64((void *)((long)in_stack_00000008 + (ulong)in_stack_00000010));
    local_48 = extraout_XMM0_00._0_8_;
    pmovzxbw(extraout_XMM0_00,local_48);
    highbd_blend_a64_d16_mask_w8_sse4_1
              (in_stack_00000168,in_stack_00000164,in_stack_00000158,in_stack_00000154,
               in_stack_00000148,in_stack_00000144,in_stack_00000600,in_stack_00000608,
               in_stack_00000610,in_stack_00000618,in_stack_00000620,in_stack_00000628,
               in_stack_00000630);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 1));
    in_stack_00000018 = in_stack_00000018 + -2;
  } while (in_stack_00000018 != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift, const __m128i *clip_low,
    const __m128i *clip_high, const __m128i *max_mask) {
  do {
    const __m128i mask0a = _mm_cvtepu8_epi16(xx_loadl_64(mask));
    const __m128i mask0b = _mm_cvtepu8_epi16(xx_loadl_64(mask + mask_stride));
    highbd_blend_a64_d16_mask_w8_sse4_1(
        dst, dst_stride, src0, src0_stride, src1, src1_stride, &mask0a, &mask0b,
        round_offset, shift, clip_low, clip_high, max_mask);

    dst += dst_stride * 2;
    src0 += src0_stride * 2;
    src1 += src1_stride * 2;
    mask += mask_stride * 2;
  } while (h -= 2);
}